

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm.h
# Opt level: O1

bool __thiscall GF2::MM<129UL>::IsDivisibleBy(MM<129UL> *this,MM<129UL> *mRight)

{
  ulong uVar1;
  ulong uVar2;
  
  if (((mRight->super_WW<129UL>)._words[0] & ~(this->super_WW<129UL>)._words[0]) != 0) {
    return false;
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 2) break;
    uVar1 = uVar2 + 1;
  } while (((mRight->super_WW<129UL>)._words[uVar2 + 1] & ~(this->super_WW<129UL>)._words[uVar2 + 1]
           ) == 0);
  return 1 < uVar2;
}

Assistant:

bool IsDivisibleBy(const MM& mRight) const
	{	
		for (size_t pos = 0; pos < _wcount; ++pos)
			if (mRight.GetWord(pos) & ~_words[pos])
				return false;
		return true;
	}